

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,PatternOptions patternOptions)

{
  long lVar1;
  Stream *pSVar2;
  QDebug *pQVar3;
  uint in_EDX;
  undefined4 in_register_00000034;
  QDebug *dbg;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  QDebugStateSaver saver;
  
  dbg = (QDebug *)
        CONCAT44(in_register_00000034,
                 patternOptions.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
                 super_QFlagsStorage<QRegularExpression::PatternOption>.i);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,dbg);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char *)0x0;
  local_48.size = 0;
  if (in_EDX == 0) {
    QByteArray::operator=((QByteArray *)&local_48,"NoPatternOption");
  }
  else {
    QByteArray::reserve((QByteArray *)&local_48,200);
    if ((in_EDX & 1) != 0) {
      QByteArray::append((QByteArray *)&local_48,"CaseInsensitiveOption|");
    }
    if ((in_EDX & 2) != 0) {
      QByteArray::append((QByteArray *)&local_48,"DotMatchesEverythingOption|");
    }
    if ((in_EDX & 4) != 0) {
      QByteArray::append((QByteArray *)&local_48,"MultilineOption|");
    }
    if ((in_EDX & 8) != 0) {
      QByteArray::append((QByteArray *)&local_48,"ExtendedPatternSyntaxOption|");
    }
    if ((in_EDX & 0x10) != 0) {
      QByteArray::append((QByteArray *)&local_48,"InvertedGreedinessOption|");
    }
    if ((in_EDX & 0x20) != 0) {
      QByteArray::append((QByteArray *)&local_48,"DontCaptureOption|");
    }
    if ((in_EDX & 0x40) != 0) {
      QByteArray::append((QByteArray *)&local_48,"UseUnicodePropertiesOption|");
    }
    QByteArray::chop((QByteArray *)&local_48,1);
  }
  dbg->stream->space = false;
  pQVar3 = QDebug::operator<<(dbg,"QRegularExpression::PatternOptions(");
  pQVar3 = QDebug::operator<<(pQVar3,(QByteArray *)&local_48);
  QDebug::operator<<(pQVar3,')');
  pSVar2 = dbg->stream;
  dbg->stream = (Stream *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar2;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QRegularExpression::PatternOptions patternOptions)
{
    QDebugStateSaver saver(debug);
    QByteArray flags;

    if (patternOptions == QRegularExpression::NoPatternOption) {
        flags = "NoPatternOption";
    } else {
        flags.reserve(200); // worst case...
        if (patternOptions & QRegularExpression::CaseInsensitiveOption)
            flags.append("CaseInsensitiveOption|");
        if (patternOptions & QRegularExpression::DotMatchesEverythingOption)
            flags.append("DotMatchesEverythingOption|");
        if (patternOptions & QRegularExpression::MultilineOption)
            flags.append("MultilineOption|");
        if (patternOptions & QRegularExpression::ExtendedPatternSyntaxOption)
            flags.append("ExtendedPatternSyntaxOption|");
        if (patternOptions & QRegularExpression::InvertedGreedinessOption)
            flags.append("InvertedGreedinessOption|");
        if (patternOptions & QRegularExpression::DontCaptureOption)
            flags.append("DontCaptureOption|");
        if (patternOptions & QRegularExpression::UseUnicodePropertiesOption)
            flags.append("UseUnicodePropertiesOption|");
        flags.chop(1);
    }

    debug.nospace() << "QRegularExpression::PatternOptions(" << flags << ')';

    return debug;
}